

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int BrotliEncoderCompressStream
              (BrotliEncoderState *s,BrotliEncoderOperation op,size_t *available_in,
              uint8_t **next_in,size_t *available_out,uint8_t **next_out,size_t *total_out)

{
  int iVar1;
  uint is_last_00;
  uint force_flush_00;
  size_t sVar2;
  size_t local_78;
  int result;
  int force_flush;
  int is_last;
  size_t copy_input_size;
  size_t remaining_block_size;
  uint8_t **next_out_local;
  size_t *available_out_local;
  uint8_t **next_in_local;
  size_t *available_in_local;
  BrotliEncoderOperation op_local;
  BrotliEncoderState *s_local;
  
  iVar1 = EnsureInitialized(s);
  if (iVar1 == 0) {
    return 0;
  }
  if (s->remaining_metadata_bytes_ != 0xffffffff) {
    if (*available_in != (ulong)s->remaining_metadata_bytes_) {
      return 0;
    }
    if (op != BROTLI_OPERATION_EMIT_METADATA) {
      return 0;
    }
  }
  if (op == BROTLI_OPERATION_EMIT_METADATA) {
    UpdateSizeHint(s,0);
    s_local._4_4_ = ProcessMetadata(s,available_in,next_in,available_out,next_out,total_out);
  }
  else if ((s->stream_state_ == BROTLI_STREAM_METADATA_HEAD) ||
          (s->stream_state_ == BROTLI_STREAM_METADATA_BODY)) {
    s_local._4_4_ = 0;
  }
  else if ((s->stream_state_ == BROTLI_STREAM_PROCESSING) || (*available_in == 0)) {
    if (((s->params).quality == 0) || ((s->params).quality == 1)) {
      s_local._4_4_ =
           BrotliEncoderCompressStreamFast
                     (s,op,available_in,next_in,available_out,next_out,total_out);
    }
    else {
      while( true ) {
        do {
          while ((sVar2 = RemainingInputBlockSize(s), sVar2 != 0 && (*available_in != 0))) {
            local_78 = *available_in;
            if (sVar2 < local_78) {
              local_78 = sVar2;
            }
            CopyInputToRingBuffer(s,local_78,*next_in);
            *next_in = *next_in + local_78;
            *available_in = *available_in - local_78;
          }
          iVar1 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
        } while (iVar1 != 0);
        if (((s->available_out_ != 0) || (s->stream_state_ != BROTLI_STREAM_PROCESSING)) ||
           ((sVar2 != 0 && (op == BROTLI_OPERATION_PROCESS)))) {
          CheckFlushComplete(s);
          return 1;
        }
        is_last_00 = (uint)(*available_in == 0 && op == BROTLI_OPERATION_FINISH);
        force_flush_00 = (uint)(*available_in == 0 && op == BROTLI_OPERATION_FLUSH);
        UpdateSizeHint(s,*available_in);
        iVar1 = EncodeData(s,is_last_00,force_flush_00,&s->available_out_,&s->next_out_);
        if (iVar1 == 0) break;
        if (force_flush_00 != 0) {
          s->stream_state_ = BROTLI_STREAM_FLUSH_REQUESTED;
        }
        if (is_last_00 != 0) {
          s->stream_state_ = BROTLI_STREAM_FINISHED;
        }
      }
      s_local._4_4_ = 0;
    }
  }
  else {
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

BROTLI_BOOL BrotliEncoderCompressStream(
    BrotliEncoderState* s, BrotliEncoderOperation op, size_t* available_in,
    const uint8_t** next_in, size_t* available_out,uint8_t** next_out,
    size_t* total_out) {
  if (!EnsureInitialized(s)) return BROTLI_FALSE;

  /* Unfinished metadata block; check requirements. */
  if (s->remaining_metadata_bytes_ != BROTLI_UINT32_MAX) {
    if (*available_in != s->remaining_metadata_bytes_) return BROTLI_FALSE;
    if (op != BROTLI_OPERATION_EMIT_METADATA) return BROTLI_FALSE;
  }

  if (op == BROTLI_OPERATION_EMIT_METADATA) {
    UpdateSizeHint(s, 0);  /* First data metablock might be emitted here. */
    return ProcessMetadata(
        s, available_in, next_in, available_out, next_out, total_out);
  }

  if (s->stream_state_ == BROTLI_STREAM_METADATA_HEAD ||
      s->stream_state_ == BROTLI_STREAM_METADATA_BODY) {
    return BROTLI_FALSE;
  }

  if (s->stream_state_ != BROTLI_STREAM_PROCESSING && *available_in != 0) {
    return BROTLI_FALSE;
  }
  if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    return BrotliEncoderCompressStreamFast(s, op, available_in, next_in,
        available_out, next_out, total_out);
  }
  while (BROTLI_TRUE) {
    size_t remaining_block_size = RemainingInputBlockSize(s);

    if (remaining_block_size != 0 && *available_in != 0) {
      size_t copy_input_size =
          BROTLI_MIN(size_t, remaining_block_size, *available_in);
      CopyInputToRingBuffer(s, copy_input_size, *next_in);
      *next_in += copy_input_size;
      *available_in -= copy_input_size;
      continue;
    }

    if (InjectFlushOrPushOutput(s, available_out, next_out, total_out)) {
      continue;
    }

    /* Compress data only when internal output buffer is empty, stream is not
       finished and there is no pending flush request. */
    if (s->available_out_ == 0 &&
        s->stream_state_ == BROTLI_STREAM_PROCESSING) {
      if (remaining_block_size == 0 || op != BROTLI_OPERATION_PROCESS) {
        BROTLI_BOOL is_last = TO_BROTLI_BOOL(
            (*available_in == 0) && op == BROTLI_OPERATION_FINISH);
        BROTLI_BOOL force_flush = TO_BROTLI_BOOL(
            (*available_in == 0) && op == BROTLI_OPERATION_FLUSH);
        BROTLI_BOOL result;
        UpdateSizeHint(s, *available_in);
        result = EncodeData(s, is_last, force_flush,
            &s->available_out_, &s->next_out_);
        if (!result) return BROTLI_FALSE;
        if (force_flush) s->stream_state_ = BROTLI_STREAM_FLUSH_REQUESTED;
        if (is_last) s->stream_state_ = BROTLI_STREAM_FINISHED;
        continue;
      }
    }
    break;
  }
  CheckFlushComplete(s);
  return BROTLI_TRUE;
}